

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTetrahedronFace.h
# Opt level: O3

void __thiscall
chrono::fea::ChTetrahedronFace::ComputeNF
          (ChTetrahedronFace *this,double U,double V,ChVectorDynamic<> *Qi,double *detJ,
          ChVectorDynamic<> *F,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  ulong uVar10;
  ulong uVar11;
  double *pdVar12;
  double *pdVar13;
  int i;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  ChLoadableUV local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  i = (int)this;
  GetNodeN((ChTetrahedronFace *)&local_38,i);
  dVar1 = *(double *)((long)local_38 + 0x20);
  dVar2 = *(double *)((long)local_38 + 0x28);
  dVar3 = *(double *)((long)local_38 + 0x30);
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  GetNodeN((ChTetrahedronFace *)&local_38,i);
  dVar4 = *(double *)((long)local_38 + 0x20);
  dVar5 = *(double *)((long)local_38 + 0x28);
  dVar6 = *(double *)((long)local_38 + 0x30);
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  GetNodeN((ChTetrahedronFace *)&local_38,i);
  dVar7 = *(double *)((long)local_38 + 0x20);
  dVar8 = *(double *)((long)local_38 + 0x28);
  dVar9 = *(double *)((long)local_38 + 0x30);
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  dVar8 = dVar8 - dVar2;
  dVar9 = dVar9 - dVar3;
  dVar5 = dVar5 - dVar2;
  dVar7 = dVar7 - dVar1;
  dVar6 = dVar6 - dVar3;
  dVar4 = dVar4 - dVar1;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar8;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar6;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar5 * dVar9;
  auVar16 = vfmsub231sd_fma(auVar23,auVar16,auVar21);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar9;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar4;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar6 * dVar7;
  auVar18 = vfmsub231sd_fma(auVar22,auVar19,auVar18);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar7;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar4 * dVar8;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar5;
  auVar14 = vfmsub231sd_fma(auVar17,auVar14,auVar20);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = auVar18._0_8_ * auVar18._0_8_;
  auVar16 = vfmadd231sd_fma(auVar15,auVar16,auVar16);
  auVar16 = vfmadd231sd_fma(auVar16,auVar14,auVar14);
  auVar16 = vsqrtsd_avx(auVar16,auVar16);
  *detJ = auVar16._0_8_;
  uVar10 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (0 < (long)uVar10) {
    uVar11 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    if (0 < (long)uVar11) {
      pdVar12 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      pdVar13 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_data;
      dVar1 = (1.0 - U) - V;
      *pdVar13 = dVar1 * *pdVar12;
      if (uVar10 == 1) goto LAB_00634363;
      if (uVar11 != 1) {
        pdVar13[1] = dVar1 * pdVar12[1];
        if (uVar10 < 3) goto LAB_00634363;
        if ((((2 < uVar11) && (pdVar13[2] = dVar1 * pdVar12[2], uVar11 != 3)) &&
            (pdVar13[3] = U * *pdVar12, 4 < uVar11)) &&
           (((pdVar13[4] = U * pdVar12[1], uVar11 != 5 && (pdVar13[5] = U * pdVar12[2], 6 < uVar11))
            && ((pdVar13[6] = V * *pdVar12, uVar11 != 7 && (pdVar13[7] = V * pdVar12[1], 8 < uVar11)
                ))))) {
          pdVar13[8] = V * pdVar12[2];
          return;
        }
      }
    }
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                 );
  }
LAB_00634363:
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

virtual void ComputeNF(const double U,              ///< parametric coordinate in surface
                           const double V,              ///< parametric coordinate in surface
                           ChVectorDynamic<>& Qi,       ///< result of N'*F , maybe with offset block_offset
                           double& detJ,                ///< det[J]
                           const ChVectorDynamic<>& F,  ///< Input F vector, size is = n.field coords.
                           ChVectorDynamic<>* state_x,  ///< if != 0, update state (pos. part) to this, then evaluate Q
                           ChVectorDynamic<>* state_w   ///< if != 0, update state (speed part) to this, then evaluate Q
                           ) override {
        // evaluate shape functions (in compressed vector), btw. not dependant on state
        // note: U,V in 0..1 range, thanks to IsTriangleIntegrationNeeded() {return true;}
        ChVectorN<double, 3> N;
        this->ShapeFunctions(N, U, V);

        // determinant of jacobian is also =2*areaoftriangle, also length of cross product of sides
        ChVector<> p0 = GetNodeN(0)->GetPos();
        ChVector<> p1 = GetNodeN(1)->GetPos();
        ChVector<> p2 = GetNodeN(2)->GetPos();
        detJ = (Vcross(p2 - p0, p1 - p0)).Length();

        Qi(0) = N(0) * F(0);
        Qi(1) = N(0) * F(1);
        Qi(2) = N(0) * F(2);
        Qi(3) = N(1) * F(0);
        Qi(4) = N(1) * F(1);
        Qi(5) = N(1) * F(2);
        Qi(6) = N(2) * F(0);
        Qi(7) = N(2) * F(1);
        Qi(8) = N(2) * F(2);
    }